

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FPTest_Subtract_Test::TestBody(FPTest_Subtract_Test *this)

{
  fp x;
  undefined1 uVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertHelper *this_00;
  fp fVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  fp v;
  AssertHelper *in_stack_ffffffffffffff20;
  unsigned_long *in_stack_ffffffffffffff28;
  AssertionResult *pAVar5;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int e_val;
  Type type;
  undefined7 in_stack_ffffffffffffff50;
  AssertionResult local_90 [2];
  Message *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar6;
  AssertionResult local_58;
  significand_type local_48;
  int local_40;
  fp local_38;
  fp local_28;
  significand_type local_18;
  int local_10;
  
  e_val = 1;
  fmt::v5::internal::fp::fp(&local_28,0x7b,1);
  fmt::v5::internal::fp::fp(&local_38,0x66,e_val);
  x.f._4_4_ = in_stack_ffffffffffffff3c;
  x.f._0_4_ = in_stack_ffffffffffffff38;
  x.e = in_stack_ffffffffffffff40;
  x._12_4_ = e_val;
  fVar4._8_7_ = in_stack_ffffffffffffff30;
  fVar4.f = (significand_type)in_stack_ffffffffffffff28;
  fVar4._15_1_ = in_stack_ffffffffffffff37;
  fVar4 = fmt::v5::internal::operator-(x,fVar4);
  local_48 = fVar4.f;
  local_40 = fVar4.e;
  uVar6 = 0x15;
  pAVar5 = &local_58;
  local_18 = local_48;
  local_10 = local_40;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(uint *)in_stack_ffffffffffffff20);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  type = (Type)((ulong)pAVar5 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f8c9);
    in_stack_ffffffffffffff38 = SUB84(pcVar3,0);
    in_stack_ffffffffffffff3c = (int)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff50),type,
               (char *)CONCAT44(e_val,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c,
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar6,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
    testing::Message::~Message((Message *)0x10f917);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f960);
  pAVar5 = local_90;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),(int *)pAVar5,
             (int *)in_stack_ffffffffffffff20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10f9ef)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff50),type,
               (char *)CONCAT44(e_val,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff30));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar6,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10fa3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fa83);
  return;
}

Assistant:

TEST(FPTest, Subtract) {
  auto v = fp(123, 1) - fp(102, 1);
  EXPECT_EQ(v.f, 21u);
  EXPECT_EQ(v.e, 1);
}